

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_setmetatable(lua_State *L)

{
  Node *pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  TValue *pTVar6;
  StkId pTVar7;
  int *piVar8;
  StkId pTVar9;
  undefined1 *puVar10;
  StkId pTVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  pTVar6 = L->base + 1;
  if ((pTVar6 < L->top) && (pTVar6 != &luaO_nilobject_)) {
    iVar5 = L->base[1].tt;
    iVar16 = 1;
    luaL_checktype(L,1,5);
    if ((iVar5 == 0) || (iVar5 == 5)) {
      iVar5 = lua_getmetatable(L,iVar16);
      if (iVar5 == 0) {
        pTVar7 = L->top;
      }
      else {
        lua_pushlstring(L,"__metatable",0xb);
        pTVar7 = L->top;
        pTVar6 = luaH_get(&(pTVar7[-2].value.gc)->h,pTVar7 + -1);
        pTVar7[-1].value = pTVar6->value;
        pTVar7[-1].tt = pTVar6->tt;
        pNVar1 = (Node *)L->top;
        if ((pNVar1 == &dummynode_) || (*(int *)((long)&pNVar1[-1].i_key + 0x10) != 0)) {
          lua_remove(L,-2);
          luaL_error(L,"cannot change a protected metatable");
        }
        pTVar7 = (StkId)&pNVar1[-1].i_val.tt;
      }
      auVar4 = _DAT_00115030;
      auVar3 = _DAT_00115020;
      auVar2 = _DAT_00115010;
      pTVar9 = L->base + 2;
      if (pTVar7 < pTVar9) {
        pTVar11 = pTVar7 + 1;
        if (pTVar7 + 1 < pTVar9) {
          pTVar11 = pTVar9;
        }
        puVar10 = (undefined1 *)((long)&pTVar11->value + ~(ulong)pTVar7);
        auVar15._8_4_ = (int)puVar10;
        auVar15._0_8_ = puVar10;
        auVar15._12_4_ = (int)((ulong)puVar10 >> 0x20);
        auVar13._0_8_ = (ulong)puVar10 >> 4;
        auVar13._8_8_ = auVar15._8_8_ >> 4;
        piVar8 = &pTVar7[3].tt;
        uVar12 = 0;
        auVar13 = auVar13 ^ _DAT_00115030;
        do {
          auVar14._8_4_ = (int)uVar12;
          auVar14._0_8_ = uVar12;
          auVar14._12_4_ = (int)(uVar12 >> 0x20);
          auVar15 = (auVar14 | auVar3) ^ auVar4;
          iVar5 = auVar13._4_4_;
          if ((bool)(~(auVar15._4_4_ == iVar5 && auVar13._0_4_ < auVar15._0_4_ ||
                      iVar5 < auVar15._4_4_) & 1)) {
            piVar8[-0xc] = 0;
          }
          if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
              auVar15._12_4_ <= auVar13._12_4_) {
            piVar8[-8] = 0;
          }
          auVar15 = (auVar14 | auVar2) ^ auVar4;
          iVar16 = auVar15._4_4_;
          if (iVar16 <= iVar5 && (iVar16 != iVar5 || auVar15._0_4_ <= auVar13._0_4_)) {
            piVar8[-4] = 0;
            *piVar8 = 0;
          }
          uVar12 = uVar12 + 4;
          piVar8 = piVar8 + 0x10;
        } while ((((ulong)puVar10 >> 4) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      L->top = pTVar9;
      lua_setmetatable(L,1);
      return 1;
    }
  }
  else {
    luaL_checktype(L,1,5);
  }
  luaL_argerror(L,2,"nil or table expected");
}

Assistant:

static int luaB_setmetatable(lua_State*L){
int t=lua_type(L,2);
luaL_checktype(L,1,5);
luaL_argcheck(L,t==0||t==5,2,
"nil or table expected");
if(luaL_getmetafield(L,1,"__metatable"))
luaL_error(L,"cannot change a protected metatable");
lua_settop(L,2);
lua_setmetatable(L,1);
return 1;
}